

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_mp_check_exact(void)

{
  int iVar1;
  char *local_60;
  char *p_10;
  char *p_9;
  char *p_8;
  char *p_7;
  char *p_6;
  char *p_5;
  char *p_4;
  char *p_3;
  char *p_2;
  char *p_1;
  char *p;
  
  _plan(0xb,true);
  _space(_stdout);
  printf("# *** %s ***\n","test_mp_check_exact");
  p_1 = anon_var_dwarf_10e0 + 0x12;
  iVar1 = mp_check_exact(&p_1,anon_var_dwarf_10e0 + 0x12);
  _ok((uint)(iVar1 != 0),"mp_check_exact(&p, p + sizeof(\"\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5f6,
      "empty");
  p_2 = anon_var_dwarf_7883;
  iVar1 = mp_check_exact(&p_2,anon_var_dwarf_7883 + 3);
  _ok((uint)(iVar1 != 0),"mp_check_exact(&p, p + sizeof(\"\\x92\\xc0\\xc1\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5f7,
      "ill");
  p_3 = anon_var_dwarf_8657 + 3;
  iVar1 = mp_check_exact(&p_3,anon_var_dwarf_8657 + 4);
  _ok((uint)(iVar1 != 0),"mp_check_exact(&p, p + sizeof(\"\\x92\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5f9,
      "trunc 1");
  p_4 = anon_var_dwarf_78cb;
  iVar1 = mp_check_exact(&p_4,anon_var_dwarf_78cb + 2);
  _ok((uint)(iVar1 != 0),"mp_check_exact(&p, p + sizeof(\"\\x92\\xc0\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5fa,
      "trunc 2");
  p_5 = anon_var_dwarf_78ef;
  iVar1 = mp_check_exact(&p_5,anon_var_dwarf_78ef + 3);
  _ok((uint)(iVar1 != 0),"mp_check_exact(&p, p + sizeof(\"\\x93\\xc0\\xc0\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5fb,
      "trunc 3");
  p_6 = anon_var_dwarf_7967 + 3;
  iVar1 = mp_check_exact(&p_6,anon_var_dwarf_7967 + 5);
  _ok((uint)(iVar1 != 0),"mp_check_exact(&p, p + sizeof(\"\\xc0\\xc0\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5fd,
      "junk 1");
  p_7 = anon_var_dwarf_7937;
  iVar1 = mp_check_exact(&p_7,anon_var_dwarf_7937 + 4);
  _ok((uint)(iVar1 != 0),"mp_check_exact(&p, p + sizeof(\"\\x92\\xc0\\xc0\\xc0\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5fe,
      "junk 2");
  p_8 = anon_var_dwarf_7967;
  iVar1 = mp_check_exact(&p_8,anon_var_dwarf_7967 + 5);
  _ok((uint)(iVar1 != 0),"mp_check_exact(&p, p + sizeof(\"\\x92\\xc0\\x91\\xc0\\xc0\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5ff,
      "junk 3");
  p_9 = anon_var_dwarf_85eb + 2;
  iVar1 = mp_check_exact(&p_9,anon_var_dwarf_85eb + 3);
  _ok((uint)(iVar1 == 0),"mp_check_exact(&p, p + sizeof(\"\\xc0\") - 1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x601,
      "valid 1");
  p_10 = anon_var_dwarf_79df + 2;
  iVar1 = mp_check_exact(&p_10,anon_var_dwarf_79df + 4);
  _ok((uint)(iVar1 == 0),"mp_check_exact(&p, p + sizeof(\"\\x91\\xc0\") - 1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x602,
      "valid 2");
  local_60 = anon_var_dwarf_79df;
  iVar1 = mp_check_exact(&local_60,anon_var_dwarf_79df + 4);
  _ok((uint)(iVar1 == 0),"mp_check_exact(&p, p + sizeof(\"\\x92\\xc0\\x91\\xc0\") - 1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x603,
      "valid 3");
  _space(_stdout);
  printf("# *** %s: done ***\n","test_mp_check_exact");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

static int
test_mp_check_exact(void)
{
	plan(11);
	header();

#define invalid(data, fmt, ...) ({ \
	const char *p = data; \
	isnt(mp_check_exact(&p, p + sizeof(data) - 1), 0, fmt, ## __VA_ARGS__); \
})
#define valid(data, fmt, ...) ({ \
	const char *p = data; \
	is(mp_check_exact(&p, p + sizeof(data) - 1), 0, fmt, ## __VA_ARGS__); \
})

	invalid("", "empty");
	invalid("\x92\xc0\xc1", "ill");

	invalid("\x92", "trunc 1");
	invalid("\x92\xc0", "trunc 2");
	invalid("\x93\xc0\xc0", "trunc 3");

	invalid("\xc0\xc0", "junk 1");
	invalid("\x92\xc0\xc0\xc0", "junk 2");
	invalid("\x92\xc0\x91\xc0\xc0", "junk 3");

	valid("\xc0", "valid 1");
	valid("\x91\xc0", "valid 2");
	valid("\x92\xc0\x91\xc0", "valid 3");

#undef valid
#undef invalid

	footer();
	return check_plan();
}